

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O2

CK_RV __thiscall
SoftHSM::getDSAPublicKey(SoftHSM *this,DSAPublicKey *publicKey,Token *token,OSObject *key)

{
  int iVar1;
  undefined1 uVar2;
  undefined7 uVar3;
  uchar *in_R8;
  size_t in_R9;
  CK_RV CVar4;
  ByteString local_f0;
  ByteString value;
  ByteString generator;
  ByteString subprime;
  ByteString prime;
  
  uVar3 = (undefined7)((ulong)key >> 8);
  uVar2 = token == (Token *)0x0 || publicKey == (DSAPublicKey *)0x0;
  if (key == (OSObject *)0x0 || (token == (Token *)0x0 || publicKey == (DSAPublicKey *)0x0)) {
    return 7;
  }
  iVar1 = (*key->_vptr_OSObject[4])(key,2,0);
  ByteString::ByteString(&prime);
  ByteString::ByteString(&subprime);
  ByteString::ByteString(&generator);
  ByteString::ByteString(&value);
  if ((char)iVar1 == '\0') {
    (*key->_vptr_OSObject[6])(&local_f0,key,0x130);
    ByteString::operator=(&prime,&local_f0);
    ByteString::~ByteString(&local_f0);
    (*key->_vptr_OSObject[6])(&local_f0,key,0x131);
    ByteString::operator=(&subprime,&local_f0);
    ByteString::~ByteString(&local_f0);
    (*key->_vptr_OSObject[6])(&local_f0,key,0x132);
    ByteString::operator=(&generator,&local_f0);
    ByteString::~ByteString(&local_f0);
    (*key->_vptr_OSObject[6])(&local_f0,key,0x11);
    ByteString::operator=(&value,&local_f0);
    ByteString::~ByteString(&local_f0);
  }
  else {
    (*key->_vptr_OSObject[6])(&local_f0,key,0x130);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f0,(uchar *)&prime,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_f0);
    CVar4 = 5;
    if ((char)iVar1 == '\0') goto LAB_001376f2;
    (*key->_vptr_OSObject[6])(&local_f0,key,0x131);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f0,(uchar *)&subprime,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_f0);
    if ((char)iVar1 == '\0') goto LAB_001376f2;
    (*key->_vptr_OSObject[6])(&local_f0,key,0x132);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f0,(uchar *)&generator,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_f0);
    if ((char)iVar1 == '\0') goto LAB_001376f2;
    (*key->_vptr_OSObject[6])(&local_f0,key,0x11);
    iVar1 = Token::decrypt(token,(EVP_PKEY_CTX *)&local_f0,(uchar *)&value,
                           (size_t *)CONCAT71(uVar3,uVar2),in_R8,in_R9);
    ByteString::~ByteString(&local_f0);
    if ((char)iVar1 == '\0') goto LAB_001376f2;
  }
  (**(code **)(*(long *)publicKey + 0x30))(publicKey,&prime);
  (**(code **)(*(long *)publicKey + 0x38))(publicKey,&subprime);
  (**(code **)(*(long *)publicKey + 0x40))(publicKey,&generator);
  (**(code **)(*(long *)publicKey + 0x48))(publicKey,&value);
  CVar4 = 0;
LAB_001376f2:
  ByteString::~ByteString(&value);
  ByteString::~ByteString(&generator);
  ByteString::~ByteString(&subprime);
  ByteString::~ByteString(&prime);
  return CVar4;
}

Assistant:

CK_RV SoftHSM::getDSAPublicKey(DSAPublicKey* publicKey, Token* token, OSObject* key)
{
	if (publicKey == NULL) return CKR_ARGUMENTS_BAD;
	if (token == NULL) return CKR_ARGUMENTS_BAD;
	if (key == NULL) return CKR_ARGUMENTS_BAD;

	// Get the CKA_PRIVATE attribute, when the attribute is not present use default false
	bool isKeyPrivate = key->getBooleanValue(CKA_PRIVATE, false);

	// DSA Public Key Attributes
	ByteString prime;
	ByteString subprime;
	ByteString generator;
	ByteString value;
	if (isKeyPrivate)
	{
		bool bOK = true;
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_PRIME), prime);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_SUBPRIME), subprime);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_BASE), generator);
		bOK = bOK && token->decrypt(key->getByteStringValue(CKA_VALUE), value);
		if (!bOK)
			return CKR_GENERAL_ERROR;
	}
	else
	{
		prime = key->getByteStringValue(CKA_PRIME);
		subprime = key->getByteStringValue(CKA_SUBPRIME);
		generator = key->getByteStringValue(CKA_BASE);
		value = key->getByteStringValue(CKA_VALUE);
	}

	publicKey->setP(prime);
	publicKey->setQ(subprime);
	publicKey->setG(generator);
	publicKey->setY(value);

	return CKR_OK;
}